

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

char * ImGui::SaveIniSettingsToMemory(size_t *out_size)

{
  ImGuiContext *pIVar1;
  int iVar2;
  ImGuiSettingsHandler *pIVar3;
  char *pcVar4;
  long *in_RDI;
  ImGuiSettingsHandler *handler;
  ImGuiSettingsHandler *__end1;
  ImGuiSettingsHandler *__begin1;
  ImVector<ImGuiSettingsHandler> *__range1;
  ImGuiContext *g;
  char *in_stack_ffffffffffffffc8;
  ImVector<char> *in_stack_ffffffffffffffd0;
  ImGuiSettingsHandler *local_28;
  
  pIVar1 = GImGui;
  GImGui->SettingsDirtyTimer = 0.0;
  ImVector<char>::resize(in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  ImVector<char>::push_back(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  local_28 = ImVector<ImGuiSettingsHandler>::begin(&pIVar1->SettingsHandlers);
  pIVar3 = ImVector<ImGuiSettingsHandler>::end(&pIVar1->SettingsHandlers);
  for (; local_28 != pIVar3; local_28 = local_28 + 1) {
    (*local_28->WriteAllFn)(pIVar1,local_28,&pIVar1->SettingsIniData);
  }
  if (in_RDI != (long *)0x0) {
    iVar2 = ImGuiTextBuffer::size(&pIVar1->SettingsIniData);
    *in_RDI = (long)iVar2;
  }
  pcVar4 = ImGuiTextBuffer::c_str(&pIVar1->SettingsIniData);
  return pcVar4;
}

Assistant:

const char* ImGui::SaveIniSettingsToMemory(size_t* out_size)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    g.SettingsIniData.Buf.resize(0);
    g.SettingsIniData.Buf.push_back(0);
    for (ImGuiSettingsHandler& handler : g.SettingsHandlers)
        handler.WriteAllFn(&g, &handler, &g.SettingsIniData);
    if (out_size)
        *out_size = (size_t)g.SettingsIniData.size();
    return g.SettingsIniData.c_str();
}